

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unsetJoinExpr(Expr *p,int iTable)

{
  int in_ESI;
  char *in_RDI;
  int i;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  char *local_8;
  
  for (local_8 = in_RDI; local_8 != (char *)0x0; local_8 = *(char **)(local_8 + 0x18)) {
    if (((*(uint *)(local_8 + 4) & 1) != 0) &&
       ((in_ESI < 0 || (*(short *)(local_8 + 0x34) == in_ESI)))) {
      *(uint *)(local_8 + 4) = *(uint *)(local_8 + 4) & 0xfffffffe;
    }
    if ((*local_8 == -99) && (*(long *)(local_8 + 0x20) != 0)) {
      for (in_stack_fffffffffffffff0 = 0; in_stack_fffffffffffffff0 < **(int **)(local_8 + 0x20);
          in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
        unsetJoinExpr((Expr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
      }
    }
    unsetJoinExpr((Expr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

static void unsetJoinExpr(Expr *p, int iTable){
  while( p ){
    if( ExprHasProperty(p, EP_FromJoin)
     && (iTable<0 || p->iRightJoinTable==iTable) ){
      ExprClearProperty(p, EP_FromJoin);
    }
    if( p->op==TK_FUNCTION && p->x.pList ){
      int i;
      for(i=0; i<p->x.pList->nExpr; i++){
        unsetJoinExpr(p->x.pList->a[i].pExpr, iTable);
      }
    }
    unsetJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}